

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

el_action_t ed_move_to_end(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  
  pwVar1 = (el->el_line).lastchar;
  (el->el_line).cursor = pwVar1;
  if ((el->el_map).type == L'\x01') {
    if ((el->el_chared).c_vcmd.action != L'\0') {
      cv_delfini(el);
      return '\x04';
    }
    if ((el->el_line).buffer < pwVar1) {
      (el->el_line).cursor = pwVar1 + -1;
    }
  }
  return '\x05';
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
ed_move_to_end(EditLine *el, wint_t c __attribute__((__unused__)))
{

	el->el_line.cursor = el->el_line.lastchar;
	if (el->el_map.type == MAP_VI) {
		if (el->el_chared.c_vcmd.action != NOP) {
			cv_delfini(el);
			return CC_REFRESH;
		}
#ifdef VI_MOVE
		if (el->el_line.cursor > el->el_line.buffer)
			el->el_line.cursor--;
#endif
	}
	return CC_CURSOR;
}